

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Aggregate(Relation *this,string *aggregate_list)

{
  ParserOptions options_00;
  element_type *peVar1;
  ClientContext *pCVar2;
  DatabaseInstance *pDVar3;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar4;
  ParserOptions options;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  expression_list;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 uStack_7f;
  undefined6 uStack_7e;
  idx_t iStack_78;
  vector<duckdb::ParserExtension,_true> *local_70;
  undefined1 local_68 [24];
  element_type *peStack_50;
  enable_shared_from_this<duckdb::Relation> local_48;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_38;
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)((long)&aggregate_list->field_2 + 8))
  ;
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_68);
  pCVar2 = shared_ptr<duckdb::ClientContext,_true>::operator->
                     ((shared_ptr<duckdb::ClientContext,_true> *)local_68);
  local_70 = (vector<duckdb::ParserExtension,_true> *)0x0;
  local_80 = (pCVar2->config).preserve_identifier_case;
  uStack_7f = (pCVar2->config).integer_division;
  iStack_78 = (pCVar2->config).max_expression_depth;
  pDVar3 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&pCVar2->db);
  local_70 = &(pDVar3->config).parser_extensions;
  options_00.integer_division = (bool)uStack_7f;
  options_00.preserve_identifier_case = (bool)local_80;
  options_00._2_6_ = uStack_7e;
  options_00.max_expression_depth = iStack_78;
  options_00.extensions = local_70;
  Parser::ParseExpressionList
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_38,in_RDX,options_00);
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_48);
  local_68._0_8_ = (AggregateRelation *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::AggregateRelation,std::allocator<duckdb::AggregateRelation>,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8),
             (AggregateRelation **)local_68,(allocator<duckdb::AggregateRelation> *)&local_81,
             (shared_ptr<duckdb::Relation,_true> *)&local_48,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_38);
  shared_ptr<duckdb::AggregateRelation,_true>::shared_ptr
            ((shared_ptr<duckdb::AggregateRelation,_true> *)(local_68 + 0x10),
             (shared_ptr<duckdb::AggregateRelation> *)local_68);
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  peVar1 = peStack_50;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peStack_50 = (element_type *)0x0;
  this->_vptr_Relation = (_func_int **)local_68._16_8_;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_68._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_48.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_38);
  sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Aggregate(const string &aggregate_list) {
	auto expression_list = Parser::ParseExpressionList(aggregate_list, context->GetContext()->GetParserOptions());
	return make_shared_ptr<AggregateRelation>(shared_from_this(), std::move(expression_list));
}